

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::VisitDirectory(cmOrderDirectories *this,uint i)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  reference ppVar4;
  reference __x;
  ConflictPair *j;
  const_iterator __end1;
  const_iterator __begin1;
  ConflictList *__range1;
  ConflictList *clist;
  uint i_local;
  cmOrderDirectories *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
  if (*pvVar3 == 0) {
    vVar1 = this->WalkId;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
    *pvVar3 = vVar1;
    this_00 = &std::
               vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
               ::operator[](&this->ConflictGraph,(ulong)i)->
               super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(this_00)
    ;
    j = (ConflictPair *)
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                       *)&j), bVar2) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end1);
      VisitDirectory(this,ppVar4->first);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&__end1);
    }
    __x = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->OriginalDirectories,(ulong)i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OrderedDirectories,__x);
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
    if (*pvVar3 == this->WalkId) {
      DiagnoseCycle(this);
    }
  }
  return;
}

Assistant:

void cmOrderDirectories::VisitDirectory(unsigned int i)
{
  // Skip nodes already visited.
  if (this->DirectoryVisited[i]) {
    if (this->DirectoryVisited[i] == this->WalkId) {
      // We have reached a node previously visited on this DFS.
      // There is a cycle.
      this->DiagnoseCycle();
    }
    return;
  }

  // We are now visiting this node so mark it.
  this->DirectoryVisited[i] = this->WalkId;

  // Visit the neighbors of the node first.
  ConflictList const& clist = this->ConflictGraph[i];
  for (ConflictPair const& j : clist) {
    this->VisitDirectory(j.first);
  }

  // Now that all directories required to come before this one have
  // been emitted, emit this directory.
  this->OrderedDirectories.push_back(this->OriginalDirectories[i]);
}